

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone_loop_search.c
# Opt level: O2

int phone_loop_search_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  cmd_ln_t *config;
  acmod_t *paVar1;
  mdef_entry_t *pmVar2;
  logmath_t *plVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  hmm_context_t *phVar6;
  long lVar7;
  acmod_t *paVar8;
  ps_search_t *ppVar9;
  ps_searchfuncs_t *ppVar10;
  long lVar11;
  long lVar12;
  dict_t *pdVar13;
  double dVar14;
  undefined4 uVar15;
  
  config = search->config;
  paVar1 = search->acmod;
  ps_search_base_reinit(search,dict,d2p);
  if ((hmm_context_t *)search[1].type != (hmm_context_t *)0x0) {
    hmm_context_free((hmm_context_t *)search[1].type);
  }
  phVar6 = hmm_context_init(paVar1->mdef->n_emit_state,paVar1->tmat->tp,(int16 *)0x0,
                            paVar1->mdef->sseq);
  search[1].type = (char *)phVar6;
  if (phVar6 == (hmm_context_t *)0x0) {
    iVar4 = -1;
  }
  else {
    *(short *)((long)&search[1].name + 2) = (short)paVar1->mdef->n_ciphone;
    lVar7 = ps_config_int(config,"pl_window");
    *(int *)&search[1].dag = (int)lVar7;
    if (search[1].acmod != (acmod_t *)0x0) {
      ckd_free(search[1].acmod);
    }
    paVar8 = (acmod_t *)
             __ckd_calloc__((long)*(short *)((long)&search[1].name + 2),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                            ,0x5b);
    search[1].acmod = paVar8;
    if (search[1].pls != (ps_search_t *)0x0) {
      ckd_free_2d(search[1].pls);
    }
    lVar7 = 4;
    ppVar9 = (ps_search_t *)
             __ckd_calloc_2d__((long)*(int *)&search[1].dag,
                               (long)*(short *)((long)&search[1].name + 2),4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                               ,0x5e);
    search[1].pls = ppVar9;
    if (search[1].vt != (ps_searchfuncs_t *)0x0) {
      lVar12 = 0;
      for (lVar11 = 0; lVar11 < *(short *)((long)&search[1].name + 2); lVar11 = lVar11 + 1) {
        hmm_deinit((hmm_t *)((long)&(search[1].vt)->start + lVar12));
        lVar12 = lVar12 + 0x58;
      }
      ckd_free(search[1].vt);
    }
    ppVar10 = (ps_searchfuncs_t *)
              __ckd_calloc__((long)*(short *)((long)&search[1].name + 2),0x58,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                             ,0x66);
    search[1].vt = ppVar10;
    lVar12 = 0;
    for (lVar11 = 0; uVar15 = (undefined4)((ulong)in_RAX >> 0x20),
        lVar11 < *(short *)((long)&search[1].name + 2); lVar11 = lVar11 + 1) {
      pmVar2 = paVar1->mdef->phone;
      hmm_init((hmm_context_t *)search[1].type,(hmm_t *)((long)&(search[1].vt)->start + lVar12),0,
               *(int *)((long)pmVar2 + lVar7 + -4),*(int *)((long)&pmVar2->ssid + lVar7));
      lVar7 = lVar7 + 0xc;
      lVar12 = lVar12 + 0x58;
    }
    pdVar13 = (dict_t *)ps_config_float(config,"pl_weight");
    search[1].dict = pdVar13;
    plVar3 = paVar1->lmath;
    dVar14 = ps_config_float(config,"pl_beam");
    iVar4 = logmath_log(plVar3,(float64)dVar14);
    *(int *)((long)&search[1].d2p + 4) = iVar4 >> 10;
    plVar3 = paVar1->lmath;
    dVar14 = ps_config_float(config,"pl_pbeam");
    iVar4 = logmath_log(plVar3,(float64)dVar14);
    *(int *)&search[1].hyp_str = iVar4 >> 10;
    plVar3 = paVar1->lmath;
    dVar14 = ps_config_float(config,"pl_pip");
    iVar5 = logmath_log(plVar3,(float64)dVar14);
    *(int *)((long)&search[1].hyp_str + 4) = iVar5 >> 10;
    iVar4 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
            ,0x72,"State beam %d Phone exit beam %d Insertion penalty %d\n",
            (ulong)*(uint *)((long)&search[1].d2p + 4),(ulong)*(uint *)&search[1].hyp_str,
            CONCAT44(uVar15,iVar5 >> 10));
  }
  return iVar4;
}

Assistant:

static int
phone_loop_search_reinit(ps_search_t *search, dict_t *dict, dict2pid_t *d2p)
{
    phone_loop_search_t *pls = (phone_loop_search_t *)search;
    cmd_ln_t *config = ps_search_config(search);
    acmod_t *acmod = ps_search_acmod(search);
    int i;

    /* Free old dict2pid, dict, if necessary. */
    ps_search_base_reinit(search, dict, d2p);

    /* Initialize HMM context. */
    if (pls->hmmctx)
        hmm_context_free(pls->hmmctx);
    pls->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (pls->hmmctx == NULL)
        return -1;

    /* Initialize penalty storage */
    pls->n_phones = bin_mdef_n_ciphone(acmod->mdef);
    pls->window = ps_config_int(config, "pl_window");
    if (pls->penalties)
        ckd_free(pls->penalties);
    pls->penalties = (int32 *)ckd_calloc(pls->n_phones, sizeof(*pls->penalties));
    if (pls->pen_buf)
        ckd_free_2d(pls->pen_buf);
    pls->pen_buf = (int32 **)ckd_calloc_2d(pls->window, pls->n_phones, sizeof(**pls->pen_buf));

    /* Initialize phone HMMs. */
    if (pls->hmms) {
        for (i = 0; i < pls->n_phones; ++i)
            hmm_deinit((hmm_t *)&pls->hmms[i]);
        ckd_free(pls->hmms);
    }
    pls->hmms = (hmm_t *)ckd_calloc(pls->n_phones, sizeof(*pls->hmms));
    for (i = 0; i < pls->n_phones; ++i) {
        hmm_init(pls->hmmctx, (hmm_t *)&pls->hmms[i],
                 FALSE,
                 bin_mdef_pid2ssid(acmod->mdef, i),
                 bin_mdef_pid2tmatid(acmod->mdef, i));
    }
    pls->penalty_weight = ps_config_float(config, "pl_weight");
    pls->beam = logmath_log(acmod->lmath, ps_config_float(config, "pl_beam")) >> SENSCR_SHIFT;
    pls->pbeam = logmath_log(acmod->lmath, ps_config_float(config, "pl_pbeam")) >> SENSCR_SHIFT;
    pls->pip = logmath_log(acmod->lmath, ps_config_float(config, "pl_pip")) >> SENSCR_SHIFT;
    E_INFO("State beam %d Phone exit beam %d Insertion penalty %d\n",
           pls->beam, pls->pbeam, pls->pip);

    return 0;
}